

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O0

void __thiscall luna::GC::GC(GC *this,GCObjectDeleter *obj_deleter,bool log)

{
  byte in_DL;
  GenInfo *in_RDI;
  function<void_(luna::GCObjectVisitor_*)> *in_stack_ffffffffffffffb0;
  function<void_(luna::GCObject_*,_unsigned_int)> *__x;
  function<void_(luna::GCObject_*,_unsigned_int)> *this_00;
  
  GenInfo::GenInfo(in_RDI);
  GenInfo::GenInfo(in_RDI + 1);
  GenInfo::GenInfo(in_RDI + 2);
  __x = (function<void_(luna::GCObject_*,_unsigned_int)> *)(in_RDI + 3);
  std::function<void_(luna::GCObjectVisitor_*)>::function(in_stack_ffffffffffffffb0);
  this_00 = (function<void_(luna::GCObject_*,_unsigned_int)> *)(in_RDI + 5);
  std::function<void_(luna::GCObjectVisitor_*)>::function(in_stack_ffffffffffffffb0);
  std::deque<luna::GCObject_*,_std::allocator<luna::GCObject_*>_>::deque
            ((deque<luna::GCObject_*,_std::allocator<luna::GCObject_*>_> *)0x135e4a);
  std::function<void_(luna::GCObject_*,_unsigned_int)>::function(this_00,__x);
  std::ofstream::ofstream(in_RDI + 0xe);
  in_RDI->threshold_count_ = 0x200;
  in_RDI[1].threshold_count_ = 0x200;
  if ((in_DL & 1) != 0) {
    std::ofstream::open(in_RDI + 0xe,"gc.log",0x10);
  }
  return;
}

Assistant:

GC::GC(const GCObjectDeleter &obj_deleter, bool log)
        : obj_deleter_(obj_deleter)
    {
        gen0_.threshold_count_ = kGen0InitThresholdCount;
        gen1_.threshold_count_ = kGen1InitThresholdCount;

        if (log)
        {
            log_stream_.open("gc.log");
        }
    }